

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

iterator __thiscall
QHash<QRhiResource*,std::pair<int,bool>>::emplace<std::pair<int,bool>const&>
          (QHash<QRhiResource*,std::pair<int,bool>> *this,QRhiResource **key,pair<int,_bool> *args)

{
  Data<QHashPrivate::Node<QRhiResource_*,_std::pair<int,_bool>_>_> *pDVar1;
  pair<int,_bool> pVar2;
  long in_FS_OFFSET;
  piter pVar3;
  pair<int,_bool> local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pVar2 = *(pair<int,_bool> *)this;
  if (pVar2 == (pair<int,_bool>)0x0) {
    local_28.first = 0;
    local_28.second = false;
    local_28._5_3_ = 0;
LAB_0057a3db:
    pVar2.first = 0;
    pVar2.second = false;
    pVar2._5_3_ = 0;
LAB_0057a3fc:
    pDVar1 = QHashPrivate::Data<QHashPrivate::Node<QRhiResource_*,_std::pair<int,_bool>_>_>::
             detached((Data<QHashPrivate::Node<QRhiResource_*,_std::pair<int,_bool>_>_> *)pVar2);
    *(Data<QHashPrivate::Node<QRhiResource_*,_std::pair<int,_bool>_>_> **)this = pDVar1;
  }
  else {
    if (*(uint *)pVar2 < 2) {
      if (*(size_t *)((long)pVar2 + 8) < *(size_t *)((long)pVar2 + 0x10) >> 1) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          pVar3 = (piter)emplace_helper<std::pair<int,bool>const&>(this,key,args);
          return (iterator)pVar3;
        }
      }
      else {
        local_28.second = args->second;
        local_28.first = args->first;
        pVar3 = (piter)emplace_helper<std::pair<int,bool>>(this,key,&local_28);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          return (iterator)pVar3;
        }
      }
      goto LAB_0057a46a;
    }
    local_28 = pVar2;
    if (*(uint *)pVar2 != 0xffffffff) {
      LOCK();
      *(uint *)pVar2 = *(uint *)pVar2 + 1;
      UNLOCK();
      pVar2 = *(pair<int,_bool> *)this;
      if (pVar2 == (pair<int,_bool>)0x0) goto LAB_0057a3db;
    }
    if (1 < *(uint *)pVar2) goto LAB_0057a3fc;
  }
  pVar3 = (piter)emplace_helper<std::pair<int,bool>const&>(this,key,args);
  QHash<QRhiResource_*,_std::pair<int,_bool>_>::~QHash
            ((QHash<QRhiResource_*,_std::pair<int,_bool>_> *)&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar3;
  }
LAB_0057a46a:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }